

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadLinkingSection(BinaryReader *this,Offset section_size)

{
  ulong uVar1;
  uint32_t uVar2;
  int iVar3;
  Result RVar4;
  Enum EVar5;
  char *pcVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  uint local_6c;
  uint32_t kind;
  uint32_t flags;
  Address alignment_log2;
  uint32_t value;
  char *pcStack_50;
  uint32_t index;
  uint32_t size;
  uint32_t linking_type;
  uint32_t version;
  
  iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc3])();
  if (iVar3 == 0) {
    RVar4 = ReadU32Leb128(this,&version,"version");
    EVar5 = Error;
    if (RVar4.enum_ != Error) {
      if (version == 2) {
        if ((this->state_).offset < this->read_end_) {
          do {
            RVar4 = ReadU32Leb128(this,&linking_type,"type");
            if (RVar4.enum_ == Error) {
              return (Result)Error;
            }
            RVar4 = ReadU32Leb128(this,&value,"subsection size");
            if (RVar4.enum_ == Error) {
              return (Result)Error;
            }
            uVar7 = (_value & 0xffffffff) + (this->state_).offset;
            uVar1 = this->read_end_;
            if (uVar1 < uVar7) {
              pcVar6 = "invalid sub-section size: extends past end";
              goto LAB_001765dc;
            }
            this->read_end_ = uVar7;
            switch(linking_type) {
            case 5:
              RVar4 = ReadU32Leb128(this,&local_6c,"info count");
              if (RVar4.enum_ == Error) goto LAB_001766b3;
              iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xcb])
                                (this->delegate_,(ulong)local_6c);
              if (iVar3 != 0) {
                pcVar6 = "OnSegmentInfoCount callback failed";
LAB_001766a9:
                PrintError(this,pcVar6);
                goto LAB_001766b3;
              }
              if (local_6c != 0) {
                uVar9 = 0;
                do {
                  _value = 0;
                  pcStack_50 = (char *)0x0;
                  RVar4 = ReadStr(this,(string_view *)&value,"segment name");
                  if (((RVar4.enum_ == Error) ||
                      (RVar4 = ReadAlignment(this,&alignment_log2,"segment alignment"),
                      RVar4.enum_ == Error)) ||
                     (RVar4 = ReadU32Leb128(this,&flags,"segment flags"), RVar4.enum_ == Error))
                  goto LAB_001766b3;
                  iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xcc])
                                    (this->delegate_,uVar9,_value,pcStack_50,
                                     CONCAT44(alignment_log2._4_4_,(uint)alignment_log2),
                                     (ulong)flags);
                  if (iVar3 != 0) {
                    pcVar6 = "OnSegmentInfo callback failed";
                    goto LAB_001766a9;
                  }
                  uVar8 = (int)uVar9 + 1;
                  uVar9 = (ulong)uVar8;
                } while (uVar8 < local_6c);
              }
              break;
            case 6:
              RVar4 = ReadU32Leb128(this,&local_6c,"info count");
              if (RVar4.enum_ == Error) goto LAB_001766b3;
              iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xcd])
                                (this->delegate_,(ulong)local_6c);
              if (iVar3 != 0) {
                pcVar6 = "OnInitFunctionCount callback failed";
                goto LAB_001766a9;
              }
              while (bVar10 = local_6c != 0, local_6c = local_6c - 1, bVar10) {
                RVar4 = ReadU32Leb128(this,&value,"priority");
                if ((RVar4.enum_ == Error) ||
                   (RVar4 = ReadU32Leb128(this,(uint32_t *)&alignment_log2,"function index"),
                   RVar4.enum_ == Error)) goto LAB_001766b3;
                iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xce])
                                  (this->delegate_,_value & 0xffffffff,(ulong)(uint)alignment_log2);
                if (iVar3 != 0) {
                  pcVar6 = "OnInitFunction callback failed";
                  goto LAB_001766a9;
                }
              }
              break;
            case 7:
              RVar4 = ReadU32Leb128(this,&local_6c,"count");
              if (RVar4.enum_ == Error) goto LAB_001766b3;
              iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xcf])
                                (this->delegate_,(ulong)local_6c);
              if (iVar3 != 0) {
                pcVar6 = "OnComdatCount callback failed";
                goto LAB_001766a9;
              }
              while (bVar10 = local_6c != 0, local_6c = local_6c - 1, bVar10) {
                _value = 0;
                pcStack_50 = (char *)0x0;
                RVar4 = ReadStr(this,(string_view *)&value,"comdat name");
                if (((RVar4.enum_ == Error) ||
                    (RVar4 = ReadU32Leb128(this,(uint32_t *)&alignment_log2,"flags"),
                    RVar4.enum_ == Error)) ||
                   (RVar4 = ReadU32Leb128(this,&flags,"entry count"), RVar4.enum_ == Error))
                goto LAB_001766b3;
                iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xd0])
                                  (this->delegate_,_value,pcStack_50,(ulong)(uint)alignment_log2,
                                   (ulong)flags);
                uVar2 = flags;
                if (iVar3 != 0) {
                  pcVar6 = "OnComdatBegin callback failed";
                  goto LAB_001766a9;
                }
                while (flags = uVar2 - 1, uVar2 != 0) {
                  RVar4 = ReadU32Leb128(this,&kind,"kind");
                  if ((RVar4.enum_ == Error) ||
                     (RVar4 = ReadU32Leb128(this,&index,"index"), RVar4.enum_ == Error))
                  goto LAB_001766b3;
                  iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xd1])
                                    (this->delegate_,(ulong)kind,(ulong)index);
                  uVar2 = flags;
                  if (iVar3 != 0) {
                    pcVar6 = "OnComdatEntry callback failed";
                    goto LAB_001766a9;
                  }
                }
              }
              break;
            case 8:
              RVar4 = ReadU32Leb128(this,&local_6c,"sym count");
              if (RVar4.enum_ == Error) goto LAB_001766b3;
              iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc4])
                                (this->delegate_,(ulong)local_6c);
              if (iVar3 != 0) {
                pcVar6 = "OnSymbolCount callback failed";
                goto LAB_001766a9;
              }
              if (local_6c != 0) {
                uVar9 = 0;
                do {
                  _value = 0;
                  pcStack_50 = (char *)0x0;
                  alignment_log2._0_4_ = 0;
                  flags = 0;
                  RVar4 = ReadU32Leb128(this,&flags,"sym type");
                  if ((RVar4.enum_ == Error) ||
                     (RVar4 = ReadU32Leb128(this,(uint32_t *)&alignment_log2,"sym flags"),
                     uVar2 = flags, RVar4.enum_ == Error)) goto LAB_001766b3;
                  if (flags < 6) {
                    if ((0x35U >> (flags & 0x1f) & 1) == 0) {
                      if (flags == 1) {
                        kind = 0;
                        index = 0;
                        size = 0;
                        RVar4 = ReadStr(this,(string_view *)&value,"symbol name");
                        if ((RVar4.enum_ == Error) ||
                           ((((uint)alignment_log2 & 0x10) == 0 &&
                            (((RVar4 = ReadU32Leb128(this,&kind,"segment"), RVar4.enum_ == Error ||
                              (RVar4 = ReadU32Leb128(this,&index,"offset"), RVar4.enum_ == Error))
                             || (RVar4 = ReadU32Leb128(this,&size,"size"), RVar4.enum_ == Error)))))
                           ) goto LAB_001766b3;
                        iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc5])
                                          (this->delegate_,uVar9,(ulong)(uint)alignment_log2,_value,
                                           pcStack_50,(ulong)kind,(ulong)index,(ulong)size);
                        if (iVar3 != 0) {
                          pcVar6 = "OnDataSymbol callback failed";
                          goto LAB_001766a9;
                        }
                      }
                      else {
                        kind = 0;
                        RVar4 = ReadU32Leb128(this,&kind,"index");
                        if (RVar4.enum_ == Error) goto LAB_001766b3;
                        iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[200])
                                          (this->delegate_,uVar9,(ulong)(uint)alignment_log2,
                                           (ulong)kind);
                        if (iVar3 != 0) {
                          pcVar6 = "OnSectionSymbol callback failed";
                          goto LAB_001766a9;
                        }
                      }
                    }
                    else {
                      kind = 0;
                      RVar4 = ReadU32Leb128(this,&kind,"index");
                      if ((RVar4.enum_ == Error) ||
                         ((((uint)alignment_log2 & 0x50) != 0x10 &&
                          (RVar4 = ReadStr(this,(string_view *)&value,"symbol name"),
                          RVar4.enum_ == Error)))) goto LAB_001766b3;
                      switch(uVar2) {
                      case 0:
                        iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc6])
                                          (this->delegate_,uVar9,(ulong)(uint)alignment_log2,_value,
                                           pcStack_50,(ulong)kind);
                        if (iVar3 != 0) {
                          pcVar6 = "OnFunctionSymbol callback failed";
                          goto LAB_001766a9;
                        }
                        break;
                      default:
                        abort();
                      case 2:
                        iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[199])
                                          (this->delegate_,uVar9,(ulong)(uint)alignment_log2,_value,
                                           pcStack_50,(ulong)kind);
                        if (iVar3 != 0) {
                          pcVar6 = "OnGlobalSymbol callback failed";
                          goto LAB_001766a9;
                        }
                        break;
                      case 4:
                        iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc9])
                                          (this->delegate_,uVar9,(ulong)(uint)alignment_log2,_value,
                                           pcStack_50,(ulong)kind);
                        if (iVar3 != 0) {
                          pcVar6 = "OnTagSymbol callback failed";
                          goto LAB_001766a9;
                        }
                        break;
                      case 5:
                        iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xca])
                                          (this->delegate_,uVar9,(ulong)(uint)alignment_log2,_value,
                                           pcStack_50,(ulong)kind);
                        if (iVar3 != 0) {
                          pcVar6 = "OnTableSymbol callback failed";
                          goto LAB_001766a9;
                        }
                      }
                    }
                  }
                  uVar8 = (int)uVar9 + 1;
                  uVar9 = (ulong)uVar8;
                } while (uVar8 < local_6c);
              }
              break;
            default:
              (this->state_).offset = uVar7;
            }
            if ((this->state_).offset != uVar7) {
              PrintError(this,"unfinished sub-section (expected end: 0x%zx)",uVar7);
LAB_001766b3:
              this->read_end_ = uVar1;
              return (Result)Error;
            }
            this->read_end_ = uVar1;
          } while (uVar7 < uVar1);
        }
        iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xd2])();
        if (iVar3 == 0) {
          EVar5 = Ok;
        }
        else {
          pcVar6 = "EndLinkingSection callback failed";
LAB_001765dc:
          PrintError(this,pcVar6);
        }
      }
      else {
        PrintError(this,"invalid linking metadata version: %u");
      }
    }
  }
  else {
    PrintError(this,"BeginLinkingSection callback failed");
    EVar5 = Error;
  }
  return (Result)EVar5;
}

Assistant:

Result BinaryReader::ReadLinkingSection(Offset section_size) {
  CALLBACK(BeginLinkingSection, section_size);
  uint32_t version;
  CHECK_RESULT(ReadU32Leb128(&version, "version"));
  ERROR_UNLESS(version == 2, "invalid linking metadata version: %u", version);
  while (state_.offset < read_end_) {
    uint32_t linking_type;
    Offset subsection_size;
    CHECK_RESULT(ReadU32Leb128(&linking_type, "type"));
    CHECK_RESULT(ReadOffset(&subsection_size, "subsection size"));
    size_t subsection_end = state_.offset + subsection_size;
    ERROR_UNLESS(subsection_end <= read_end_,
                 "invalid sub-section size: extends past end");
    ReadEndRestoreGuard guard(this);
    read_end_ = subsection_end;

    uint32_t count;
    switch (static_cast<LinkingEntryType>(linking_type)) {
      case LinkingEntryType::SymbolTable:
        CHECK_RESULT(ReadU32Leb128(&count, "sym count"));
        CALLBACK(OnSymbolCount, count);
        for (Index i = 0; i < count; ++i) {
          std::string_view name;
          uint32_t flags = 0;
          uint32_t kind = 0;
          CHECK_RESULT(ReadU32Leb128(&kind, "sym type"));
          CHECK_RESULT(ReadU32Leb128(&flags, "sym flags"));
          SymbolType sym_type = static_cast<SymbolType>(kind);
          switch (sym_type) {
            case SymbolType::Function:
            case SymbolType::Global:
            case SymbolType::Tag:
            case SymbolType::Table: {
              uint32_t index = 0;
              CHECK_RESULT(ReadU32Leb128(&index, "index"));
              if ((flags & WABT_SYMBOL_FLAG_UNDEFINED) == 0 ||
                  (flags & WABT_SYMBOL_FLAG_EXPLICIT_NAME) != 0)
                CHECK_RESULT(ReadStr(&name, "symbol name"));
              switch (sym_type) {
                case SymbolType::Function:
                  CALLBACK(OnFunctionSymbol, i, flags, name, index);
                  break;
                case SymbolType::Global:
                  CALLBACK(OnGlobalSymbol, i, flags, name, index);
                  break;
                case SymbolType::Tag:
                  CALLBACK(OnTagSymbol, i, flags, name, index);
                  break;
                case SymbolType::Table:
                  CALLBACK(OnTableSymbol, i, flags, name, index);
                  break;
                default:
                  WABT_UNREACHABLE;
              }
              break;
            }
            case SymbolType::Data: {
              uint32_t segment = 0;
              uint32_t offset = 0;
              uint32_t size = 0;
              CHECK_RESULT(ReadStr(&name, "symbol name"));
              if ((flags & WABT_SYMBOL_FLAG_UNDEFINED) == 0) {
                CHECK_RESULT(ReadU32Leb128(&segment, "segment"));
                CHECK_RESULT(ReadU32Leb128(&offset, "offset"));
                CHECK_RESULT(ReadU32Leb128(&size, "size"));
              }
              CALLBACK(OnDataSymbol, i, flags, name, segment, offset, size);
              break;
            }
            case SymbolType::Section: {
              uint32_t index = 0;
              CHECK_RESULT(ReadU32Leb128(&index, "index"));
              CALLBACK(OnSectionSymbol, i, flags, index);
              break;
            }
          }
        }
        break;
      case LinkingEntryType::SegmentInfo:
        CHECK_RESULT(ReadU32Leb128(&count, "info count"));
        CALLBACK(OnSegmentInfoCount, count);
        for (Index i = 0; i < count; i++) {
          std::string_view name;
          Address alignment_log2;
          uint32_t flags;
          CHECK_RESULT(ReadStr(&name, "segment name"));
          CHECK_RESULT(ReadAlignment(&alignment_log2, "segment alignment"));
          CHECK_RESULT(ReadU32Leb128(&flags, "segment flags"));
          CALLBACK(OnSegmentInfo, i, name, alignment_log2, flags);
        }
        break;
      case LinkingEntryType::InitFunctions:
        CHECK_RESULT(ReadU32Leb128(&count, "info count"));
        CALLBACK(OnInitFunctionCount, count);
        while (count--) {
          uint32_t priority;
          uint32_t func;
          CHECK_RESULT(ReadU32Leb128(&priority, "priority"));
          CHECK_RESULT(ReadU32Leb128(&func, "function index"));
          CALLBACK(OnInitFunction, priority, func);
        }
        break;
      case LinkingEntryType::ComdatInfo:
        CHECK_RESULT(ReadU32Leb128(&count, "count"));
        CALLBACK(OnComdatCount, count);
        while (count--) {
          uint32_t flags;
          uint32_t entry_count;
          std::string_view name;
          CHECK_RESULT(ReadStr(&name, "comdat name"));
          CHECK_RESULT(ReadU32Leb128(&flags, "flags"));
          CHECK_RESULT(ReadU32Leb128(&entry_count, "entry count"));
          CALLBACK(OnComdatBegin, name, flags, entry_count);
          while (entry_count--) {
            uint32_t kind;
            uint32_t index;
            CHECK_RESULT(ReadU32Leb128(&kind, "kind"));
            CHECK_RESULT(ReadU32Leb128(&index, "index"));
            ComdatType comdat_type = static_cast<ComdatType>(kind);
            CALLBACK(OnComdatEntry, comdat_type, index);
          }
        }
        break;
      default:
        // Unknown subsection, skip it.
        state_.offset = subsection_end;
        break;
    }
    ERROR_UNLESS(state_.offset == subsection_end,
                 "unfinished sub-section (expected end: 0x%" PRIzx ")",
                 subsection_end);
  }
  CALLBACK0(EndLinkingSection);
  return Result::Ok;
}